

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void list_keys(BinarySink *bs,int ssh_version,_Bool extended)

{
  BinarySink *pBVar1;
  int iVar2;
  int *piVar3;
  strbuf *buf;
  ptrlen pl;
  uint local_44;
  uint32_t flags;
  strbuf *sb;
  PageantKey *pk;
  int i;
  _Bool extended_local;
  int ssh_version_local;
  BinarySink *bs_local;
  
  pBVar1 = bs->binarysink_;
  iVar2 = count_keys(ssh_version);
  BinarySink_put_uint32(pBVar1,(long)iVar2);
  pk._4_4_ = find_first_key_for_version(ssh_version);
  while ((piVar3 = (int *)index234(keytree,pk._4_4_), piVar3 != (int *)0x0 &&
         (*piVar3 == ssh_version))) {
    if (ssh_version < 2) {
      BinarySink_put_datapl(bs->binarysink_,*(ptrlen *)(piVar3 + 2));
    }
    else {
      BinarySink_put_stringpl(bs->binarysink_,*(ptrlen *)(piVar3 + 2));
    }
    pBVar1 = bs->binarysink_;
    pl = ptrlen_from_asciz(*(char **)(piVar3 + 8));
    BinarySink_put_stringpl(pBVar1,pl);
    if (extended) {
      buf = strbuf_new();
      local_44 = 0;
      if (*(long *)(piVar3 + 10) == 0) {
        local_44 = 2;
      }
      if (*(long *)(piVar3 + 0xc) != 0) {
        local_44 = local_44 | 1;
      }
      BinarySink_put_uint32(buf->binarysink_,(ulong)local_44);
      BinarySink_put_stringsb(bs->binarysink_,buf);
    }
    pk._4_4_ = pk._4_4_ + 1;
  }
  return;
}

Assistant:

static void list_keys(BinarySink *bs, int ssh_version, bool extended)
{
    int i;
    PageantKey *pk;

    put_uint32(bs, count_keys(ssh_version));
    for (i = find_first_key_for_version(ssh_version);
         NULL != (pk = index234(keytree, i)); i++) {
        if (pk->sort.ssh_version != ssh_version)
            break;

        if (ssh_version > 1)
            put_stringpl(bs, pk->sort.public_blob);
        else
            put_datapl(bs, pk->sort.public_blob); /* no header */

        put_stringpl(bs, ptrlen_from_asciz(pk->comment));

        if (extended) {
            /*
             * Append to each key entry a string containing extension
             * data. This string begins with a flags word, and may in
             * future contain further data if flag bits are set saying
             * that it does. Hence, it's wrapped in a containing
             * string, so that clients that only partially understand
             * it can still find the parts they do understand.
             */
            strbuf *sb = strbuf_new();

            uint32_t flags = 0;
            if (!pk->skey)
                flags |= LIST_EXTENDED_FLAG_HAS_NO_CLEARTEXT_KEY;
            if (pk->encrypted_key_file)
                flags |= LIST_EXTENDED_FLAG_HAS_ENCRYPTED_KEY_FILE;
            put_uint32(sb, flags);

            put_stringsb(bs, sb);
        }
    }
}